

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.h
# Opt level: O2

bool __thiscall
lemon::
BellmanFord<lemon::ReverseDigraph<const_lemon::SmartDigraph>,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::ReverseDigraph<const_lemon::SmartDigraph>,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
::processNextRound(BellmanFord<lemon::ReverseDigraph<const_lemon::SmartDigraph>,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::ReverseDigraph<const_lemon::SmartDigraph>,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
                   *this)

{
  DistMap *pDVar1;
  Digraph *pDVar2;
  pointer pdVar3;
  pointer pNVar4;
  pointer pNVar5;
  int *piVar6;
  pointer pNVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int i;
  long lVar11;
  int i_1;
  long lVar12;
  bool bVar13;
  double dVar14;
  reference rVar15;
  Node target;
  vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_> nextProcess;
  vector<double,_std::allocator<double>_> values;
  Value_conflict local_6d;
  Key local_6c;
  _Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
  local_68;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  lVar12 = 0;
  lVar11 = 0;
  while( true ) {
    pNVar7 = (this->_process).
             super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (long)(this->_process).
                  super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar7;
    if ((int)(uVar8 >> 2) <= lVar11) break;
    local_68._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_68._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
    ::set((VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
           *)this->_mask,(Key *)((long)&pNVar7->_id + lVar12),(Value_conflict *)&local_68);
    lVar11 = lVar11 + 1;
    lVar12 = lVar12 + 4;
  }
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,(long)uVar8 >> 2,
             (allocator_type *)&local_6c);
  pNVar7 = (this->_process).
           super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pDVar1 = this->_dist;
  pNVar5 = (this->_process).
           super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (ulong)((long)pNVar7 - (long)pNVar5) >> 2;
  uVar10 = 0;
  uVar8 = uVar9 & 0xffffffff;
  if ((int)uVar9 < 1) {
    uVar8 = uVar10;
  }
  for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
    local_48._M_impl.super__Vector_impl_data._M_start[uVar10] =
         (pDVar1->super_NodeMap<double>).
         super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>_>
         .
         super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>
         .super_Map.container.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[pNVar5[uVar10]._id];
  }
  for (lVar11 = 0; lVar11 < (int)((ulong)((long)pNVar7 - (long)pNVar5) >> 2); lVar11 = lVar11 + 1) {
    pDVar2 = this->_gr;
    piVar6 = (int *)((long)pNVar5[lVar11]._id * 8 +
                    *(long *)&(((pDVar2->
                                super_DigraphAdaptorExtender<lemon::ReverseDigraphBase<const_lemon::SmartDigraph>_>
                                ).super_ReverseDigraphBase<const_lemon::SmartDigraph>.
                                super_DigraphAdaptorBase<const_lemon::SmartDigraph>._digraph)->
                              super_ExtendedSmartDigraphBase).super_SmartDigraphBase._nodes);
    while( true ) {
      lVar12 = (long)*piVar6;
      if (lVar12 == -1) break;
      local_6c._id = *(int *)(*(long *)&(((this->_gr->
                                          super_DigraphAdaptorExtender<lemon::ReverseDigraphBase<const_lemon::SmartDigraph>_>
                                          ).super_ReverseDigraphBase<const_lemon::SmartDigraph>.
                                          super_DigraphAdaptorBase<const_lemon::SmartDigraph>.
                                         _digraph)->super_ExtendedSmartDigraphBase).
                                        super_SmartDigraphBase._arcs.
                                        super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                                        ._M_impl.super__Vector_impl_data + 4 + lVar12 * 0x10);
      dVar14 = local_48._M_impl.super__Vector_impl_data._M_start[lVar11] +
               (this->_length->
               super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_double>_>
               ).
               super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_double>
               .super_Map.container.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12];
      pdVar3 = (this->_dist->super_NodeMap<double>).
               super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>_>
               .
               super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>
               .super_Map.container.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (dVar14 < pdVar3[local_6c._id]) {
        (this->_pred->super_NodeMap<lemon::SmartDigraphBase::Arc>).
        super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>_>
        .
        super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
        .super_Map.values[local_6c._id]._id = *piVar6;
        pdVar3[local_6c._id] = dVar14;
        rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&(this->_mask->super_NodeMap<bool>).
                             super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>_>
                             .
                             super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
                             .super_Map.container,(long)local_6c._id);
        if ((*rVar15._M_p & rVar15._M_mask) == 0) {
          local_6d = true;
          VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
          ::set((VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
                 *)this->_mask,&local_6c,&local_6d);
          std::vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
          ::push_back((vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                       *)&local_68,&local_6c);
        }
      }
      piVar6 = (int *)(*(long *)&(((pDVar2->
                                   super_DigraphAdaptorExtender<lemon::ReverseDigraphBase<const_lemon::SmartDigraph>_>
                                   ).super_ReverseDigraphBase<const_lemon::SmartDigraph>.
                                   super_DigraphAdaptorBase<const_lemon::SmartDigraph>._digraph)->
                                 super_ExtendedSmartDigraphBase).super_SmartDigraphBase._arcs.
                                 super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                                 ._M_impl.super__Vector_impl_data + lVar12 * 0x10 + 8);
    }
    pNVar5 = (this->_process).
             super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar7 = (this->_process).
             super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  pNVar4 = (this->_process).
           super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_process).
  super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = local_68._M_impl.super__Vector_impl_data._M_start;
  (this->_process).
  super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = local_68._M_impl.super__Vector_impl_data._M_finish;
  (this->_process).
  super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68._M_impl.super__Vector_impl_data._M_end_of_storage;
  bVar13 = local_68._M_impl.super__Vector_impl_data._M_start ==
           local_68._M_impl.super__Vector_impl_data._M_finish;
  local_68._M_impl.super__Vector_impl_data._M_start = pNVar5;
  local_68._M_impl.super__Vector_impl_data._M_finish = pNVar7;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = pNVar4;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  std::_Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>::
  ~_Vector_base(&local_68);
  return bVar13;
}

Assistant:

bool processNextRound() {
    for (int i = 0; i < int(_process.size()); ++i) {
      _mask->set(_process[i], false);
    }
    std::vector<Node>  nextProcess;
    std::vector<Value> values(_process.size());
    for (int i = 0; i < int(_process.size()); ++i) {
      values[i] = (*_dist)[_process[i]];
    }
    for (int i = 0; i < int(_process.size()); ++i) {
      for (OutArcIt it(*_gr, _process[i]); it != INVALID; ++it) {
        Node  target  = _gr->target(it);
        Value relaxed = OperationTraits::plus(values[i], (*_length)[it]);
        if (OperationTraits::less(relaxed, (*_dist)[target])) {
          _pred->set(target, it);
          _dist->set(target, relaxed);
          if (!(*_mask)[target]) {
            _mask->set(target, true);
            nextProcess.push_back(target);
          }
        }
      }
    }
    _process.swap(nextProcess);
    return _process.empty();
  }